

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O3

void __thiscall util_tests::test_LogEscapeMessage::test_method(test_LogEscapeMessage *this)

{
  long lVar1;
  int iVar2;
  undefined1 **ppuVar3;
  iterator in_R8;
  iterator pvVar4;
  iterator in_R9;
  iterator pvVar5;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  undefined **local_108;
  undefined1 local_100;
  undefined1 *local_f8;
  string **local_f0;
  string *local_e8;
  undefined **local_e0;
  undefined1 local_d8;
  undefined1 *local_d0;
  string **local_c8;
  string *local_c0;
  char *local_b8;
  assertion_result local_b0;
  string local_98;
  undefined1 local_78 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  string NUL;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_120 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_118 = "";
  ppuVar3 = &local_130;
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x5d0;
  file.m_begin = (iterator)&local_120;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)ppuVar3,msg);
  NUL._M_string_length = NUL._M_string_length & 0xffffffffffffff00;
  NUL._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01388f08;
  NUL.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  NUL.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  str._M_str = (char *)ppuVar3;
  str._M_len = (size_t)anon_var_dwarf_1c6a760;
  BCLog::LogEscapeMessage_abi_cxx11_((string *)local_78,(BCLog *)0x14,str);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((string *)local_78,anon_var_dwarf_1c6a760);
  local_98._M_dataplus._M_p._0_1_ = iVar2 == 0;
  local_98._M_string_length = 0;
  local_98.field_2._M_allocated_capacity = 0;
  local_b0._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_b0.m_message.px = (element_type *)0xf4a3ab;
  local_c8 = &local_c0;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_01388fc8;
  local_d0 = boost::unit_test::lazy_ostream::inst;
  local_f0 = &local_e8;
  local_e8 = (string *)anon_var_dwarf_1c6a760;
  local_100 = 0;
  local_108 = &PTR__lazy_ostream_0138c540;
  local_f8 = boost::unit_test::lazy_ostream::inst;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_c0 = (string *)local_78;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_98,(lazy_ostream *)&NUL,1,2,REQUIRE,0xf51353,
             (size_t)&local_b0,0x5d0,&local_e0,anon_var_dwarf_1c6a77a,&local_108);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_98.field_2._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._0_8_ != &local_68) {
    operator_delete((void *)local_78._0_8_,local_68._M_allocated_capacity + 1);
  }
  local_140 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_138 = "";
  ppuVar3 = &local_150;
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x5d2;
  file_00.m_begin = (iterator)&local_140;
  msg_00.m_end = pvVar5;
  msg_00.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)ppuVar3,msg_00);
  NUL._M_string_length = NUL._M_string_length & 0xffffffffffffff00;
  NUL._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01388f08;
  NUL.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  NUL.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  str_00._M_str = (char *)ppuVar3;
  str_00._M_len = (size_t)"Message\n with newlines\n";
  BCLog::LogEscapeMessage_abi_cxx11_((string *)local_78,(BCLog *)0x17,str_00);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((string *)local_78,"Message\n with newlines\n");
  local_98._M_dataplus._M_p._0_1_ = iVar2 == 0;
  local_98._M_string_length = 0;
  local_98.field_2._M_allocated_capacity = 0;
  local_b0._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_b0.m_message.px = (element_type *)0xf4a3ab;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_01388fc8;
  local_d0 = boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_c0;
  local_e8 = (string *)0xf5139a;
  local_100 = 0;
  local_108 = &PTR__lazy_ostream_0138dfe0;
  local_f8 = boost::unit_test::lazy_ostream::inst;
  local_f0 = &local_e8;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_c0 = (string *)local_78;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_98,(lazy_ostream *)&NUL,1,2,REQUIRE,0xf513b2,
             (size_t)&local_b0,0x5d2,&local_e0,"\"Message\\n with newlines\\n\"",&local_108);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_98.field_2._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._0_8_ != &local_68) {
    operator_delete((void *)local_78._0_8_,local_68._M_allocated_capacity + 1);
  }
  local_160 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_158 = "";
  ppuVar3 = &local_170;
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x5d4;
  file_01.m_begin = (iterator)&local_160;
  msg_01.m_end = pvVar5;
  msg_01.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)ppuVar3,msg_01);
  NUL._M_string_length = NUL._M_string_length & 0xffffffffffffff00;
  NUL._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01388f08;
  NUL.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  NUL.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  str_01._M_str = (char *)ppuVar3;
  str_01._M_len = (size_t)"\x01\x7f Corrupted log message\r";
  BCLog::LogEscapeMessage_abi_cxx11_((string *)local_78,(BCLog *)0x19,str_01);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((string *)local_78,"\\x01\\x7f Corrupted log message\\x0d");
  local_98._M_dataplus._M_p._0_1_ = iVar2 == 0;
  local_98._M_string_length = 0;
  local_98.field_2._M_allocated_capacity = 0;
  local_b0._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_b0.m_message.px = (element_type *)0xf4a3ab;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_01388fc8;
  local_d0 = boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_c0;
  local_e8 = (string *)0xf5145b;
  local_100 = 0;
  local_108 = &PTR__lazy_ostream_01389658;
  local_f8 = boost::unit_test::lazy_ostream::inst;
  local_f0 = &local_e8;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_c0 = (string *)local_78;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_98,(lazy_ostream *)&NUL,1,2,REQUIRE,0xf5141d,
             (size_t)&local_b0,0x5d4,&local_e0,"R\"(\\x01\\x7f Corrupted log message\\x0d)\"",
             &local_108);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_98.field_2._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._0_8_ != &local_68) {
    operator_delete((void *)local_78._0_8_,local_68._M_allocated_capacity + 1);
  }
  NUL.field_2._M_allocated_capacity._0_4_ = 0x4f004f;
  NUL._M_string_length = 3;
  local_180 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_178 = "";
  ppuVar3 = &local_190;
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x5d7;
  file_02.m_begin = (iterator)&local_180;
  msg_02.m_end = pvVar5;
  msg_02.m_begin = pvVar4;
  NUL._M_dataplus._M_p = (pointer)&NUL.field_2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)ppuVar3,msg_02);
  local_78[8] = false;
  local_78._0_8_ = &PTR__lazy_ostream_01388f08;
  local_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_68._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  str_02._M_str = (char *)ppuVar3;
  str_02._M_len = (size_t)NUL._M_dataplus._M_p;
  BCLog::LogEscapeMessage_abi_cxx11_(&local_98,(BCLog *)NUL._M_string_length,str_02);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,"O\\x00O");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar2 == 0);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = (string *)0xf4a348;
  local_b8 = "";
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_01388fc8;
  local_d0 = boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_e8;
  local_f0 = (string **)&local_110;
  local_110 = "O\\x00O";
  local_100 = 0;
  local_108 = &PTR__lazy_ostream_01389008;
  local_f8 = boost::unit_test::lazy_ostream::inst;
  local_e8 = &local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,(lazy_ostream *)local_78,1,2,REQUIRE,0xf514a6,(size_t)&local_c0,0x5d7,
             &local_e0,"R\"(O\\x00O)\"",&local_108);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_98._M_dataplus._M_p._1_7_,local_98._M_dataplus._M_p._0_1_) !=
      &local_98.field_2) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_98._M_dataplus._M_p._1_7_,local_98._M_dataplus._M_p._0_1_),
                    local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)NUL._M_dataplus._M_p != &NUL.field_2) {
    operator_delete(NUL._M_dataplus._M_p,NUL.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(test_LogEscapeMessage)
{
    // ASCII and UTF-8 must pass through unaltered.
    BOOST_CHECK_EQUAL(BCLog::LogEscapeMessage("Valid log message貓"), "Valid log message貓");
    // Newlines must pass through unaltered.
    BOOST_CHECK_EQUAL(BCLog::LogEscapeMessage("Message\n with newlines\n"), "Message\n with newlines\n");
    // Other control characters are escaped in C syntax.
    BOOST_CHECK_EQUAL(BCLog::LogEscapeMessage("\x01\x7f Corrupted log message\x0d"), R"(\x01\x7f Corrupted log message\x0d)");
    // Embedded NULL characters are escaped too.
    const std::string NUL("O\x00O", 3);
    BOOST_CHECK_EQUAL(BCLog::LogEscapeMessage(NUL), R"(O\x00O)");
}